

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

HighsStatus
ipxBasicSolutionToHighsBasicSolution
          (HighsLogOptions *log_options,HighsLp *lp,vector<double,_std::allocator<double>_> *rhs,
          vector<char,_std::allocator<char>_> *constraint_type,IpxSolution *ipx_solution,
          HighsBasis *highs_basis,HighsSolution *highs_solution)

{
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer piVar6;
  pointer pHVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer piVar12;
  pointer piVar13;
  pointer pdVar14;
  pointer pdVar15;
  pointer pcVar16;
  pointer pdVar17;
  pointer pdVar18;
  pointer pdVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  HighsBasisStatus HVar23;
  ulong uVar24;
  int iVar25;
  HighsStatus HVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  uint local_c0;
  uint local_bc;
  vector<double,_std::allocator<double>_> row_activity;
  value_type_conflict1 local_38;
  
  std::vector<double,_std::allocator<double>_>::resize
            (&highs_solution->col_value,(long)lp->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&highs_solution->row_value,(long)lp->num_row_);
  this = &highs_solution->col_dual;
  std::vector<double,_std::allocator<double>_>::resize(this,(long)lp->num_col_);
  this_00 = &highs_solution->row_dual;
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)lp->num_row_);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (&highs_basis->col_status,(long)lp->num_col_);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (&highs_basis->row_status,(long)lp->num_row_);
  row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar2 = ipx_solution->num_row;
  iVar25 = lp->num_row_;
  if (iVar2 < iVar25) {
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&row_activity,(long)iVar25,&local_38);
  }
  iVar3 = lp->num_col_;
  uVar21 = (ulong)iVar3;
  if (0 < (long)uVar21) {
    piVar6 = (ipx_solution->ipx_col_status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar7 = (highs_basis->col_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (ipx_solution->ipx_col_value).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (ipx_solution->ipx_col_dual).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar10 = (highs_solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar11 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar12 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar13 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar14 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar28 = 0;
    do {
      switch(piVar6[uVar28]) {
      case 0:
        pHVar7[uVar28] = kBasic;
        pdVar10[uVar28] = pdVar8[uVar28];
        dVar32 = 0.0;
        goto LAB_002564ee;
      case -3:
        pHVar7[uVar28] = kZero;
        break;
      case -2:
        pHVar7[uVar28] = kUpper;
        break;
      case -1:
        pHVar7[uVar28] = kLower;
        break;
      default:
        highsLogDev(log_options,kError,
                    "\nError in IPX conversion: Unrecognised value ipx_col_status[%2d] = %d\n",
                    uVar28 & 0xffffffff);
        highsLogDev(log_options,kError,"Bounds [%11.4g, %11.4g]\n",
                    (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar28],
                    (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar28]);
        highsLogDev(log_options,kError,
                    "Col %2d ipx_col_status[%2d] = %2d; x[%2d] = %11.4g; z[%2d] = %11.4g\n",
                    (ipx_solution->ipx_col_value).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar28],
                    (ipx_solution->ipx_col_dual).super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar28],uVar28 & 0xffffffff,
                    uVar28 & 0xffffffff,
                    (ulong)(uint)(ipx_solution->ipx_col_status).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar28],uVar28,uVar28);
        HVar26 = kError;
        highsLogUser(log_options,kError,"Unrecognised ipx_col_status value from IPX\n");
        goto LAB_0025680d;
      }
      pdVar10[uVar28] = pdVar8[uVar28];
      dVar32 = pdVar9[uVar28];
LAB_002564ee:
      pdVar11[uVar28] = dVar32;
      if (iVar2 < iVar25) {
        iVar20 = piVar12[uVar28];
        lVar29 = (long)iVar20;
        iVar4 = piVar12[uVar28 + 1];
        if (iVar20 < iVar4) {
          do {
            iVar20 = piVar13[lVar29];
            row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar20] =
                 pdVar10[uVar28] * pdVar14[lVar29] +
                 row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar20];
            lVar29 = lVar29 + 1;
          } while (iVar4 != lVar29);
        }
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != uVar21);
  }
  iVar2 = lp->num_row_;
  uVar28 = (ulong)iVar2;
  if ((long)uVar28 < 1) {
    uVar22 = 0;
    local_bc = 0;
    local_c0 = 0;
  }
  else {
    pdVar8 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (ipx_solution->ipx_row_status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (rhs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (ipx_solution->ipx_col_value).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar14 = (ipx_solution->ipx_row_value).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (ipx_solution->ipx_row_dual).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar16 = (constraint_type->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pHVar7 = (highs_basis->row_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar17 = (highs_solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar18 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar19 = (ipx_solution->ipx_col_dual).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    piVar12 = (ipx_solution->ipx_col_status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar30 = 0;
    uVar27 = 0;
    local_c0 = 0;
    local_bc = 0;
    uVar22 = 0;
    uVar24 = uVar21;
    do {
      dVar32 = pdVar8[uVar30];
      dVar31 = pdVar9[uVar30];
      if ((-INFINITY < dVar32) || (dVar31 < INFINITY)) {
        iVar25 = (int)uVar27;
        if ((dVar32 == -INFINITY) || ((dVar31 == INFINITY || (dVar31 <= dVar32)))) {
          if (piVar6[iVar25] == 0) {
            pHVar7[uVar30] = kBasic;
            dVar31 = pdVar10[iVar25] - pdVar14[iVar25];
            dVar32 = 0.0;
          }
          else {
            dVar31 = pdVar10[iVar25] - pdVar14[iVar25];
            dVar32 = pdVar15[iVar25];
            cVar1 = pcVar16[iVar25];
            if (cVar1 == '<') {
              pHVar7[uVar30] = kUpper;
            }
            else if (cVar1 == '=') {
              pHVar7[uVar30] = (dVar32 < 0.0) * '\x02';
            }
            else {
              if (cVar1 != '>') {
                highsLogDev(log_options,kError,
                            "Error in IPX conversion: Row %2d: cannot handle constraint_type[%2d] = %d\n"
                            ,uVar30 & 0xffffffff,uVar27,(ulong)(uint)(int)cVar1);
                goto LAB_00256937;
              }
              pHVar7[uVar30] = kLower;
            }
          }
          pdVar17[uVar30] = dVar31;
          pdVar18[uVar30] = dVar32;
        }
        else {
          iVar20 = (int)uVar24;
          dVar32 = pdVar11[iVar20];
          if (piVar6[iVar25] == 0) {
            local_bc = local_bc + 1;
LAB_002566db:
            dVar31 = 0.0;
            HVar23 = kBasic;
          }
          else {
            dVar31 = pdVar19[iVar20];
            uVar5 = piVar12[iVar20];
            if (uVar5 == 0xfffffffe) {
              HVar23 = kUpper;
            }
            else {
              if (uVar5 != 0xffffffff) {
                if (uVar5 == 0) {
                  local_c0 = local_c0 + 1;
                  goto LAB_002566db;
                }
                highsLogDev(log_options,kError,
                            "Error in IPX conversion: Row %2d (IPX row %2d) has unrecognised value ipx_col_status[%2d] = %d\n"
                            ,uVar30 & 0xffffffff,uVar27,uVar24 & 0xffffffff,(ulong)uVar5);
LAB_00256937:
                highsLogDev(log_options,kError,"Bounds [%11.4g, %11.4g]\n",
                            (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar30],
                            (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar30]);
                highsLogDev(log_options,kError,
                            "Row %2d ipx_row_status[%2d] = %2d; s[%2d] = %11.4g; y[%2d] = %11.4g\n",
                            (ipx_solution->ipx_row_value).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar25],
                            (ipx_solution->ipx_row_dual).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar25],uVar30 & 0xffffffff,uVar27,
                            (ulong)(uint)(ipx_solution->ipx_row_status).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[iVar25],uVar27,uVar27);
                HVar26 = kError;
                highsLogUser(log_options,kError,"Unrecognised ipx_row_status value from IPX\n");
                goto LAB_0025680d;
              }
              HVar23 = kLower;
            }
          }
          uVar22 = (ulong)((int)uVar22 + 1);
          pHVar7[uVar30] = HVar23;
          pdVar17[uVar30] = dVar32;
          pdVar18[uVar30] = dVar31;
          uVar24 = (ulong)(iVar20 + 1);
        }
        uVar27 = (ulong)(iVar25 + 1);
      }
      else {
        pHVar7[uVar30] = kBasic;
        pdVar17[uVar30] =
             row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar30];
        pdVar18[uVar30] = 0.0;
      }
      uVar30 = uVar30 + 1;
    } while (uVar28 != uVar30);
  }
  if (lp->sense_ == kMaximize) {
    if (0 < iVar3) {
      pdVar8 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar24 = 0;
      do {
        pdVar8[uVar24] = -pdVar8[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar21 != uVar24);
    }
    if (0 < iVar2) {
      pdVar8 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar21 = 0;
      do {
        pdVar8[uVar21] = -pdVar8[uVar21];
        uVar21 = uVar21 + 1;
      } while (uVar28 != uVar21);
    }
  }
  if ((int)uVar22 != 0) {
    highsLogDev(log_options,kInfo,"Of %d boxed rows: %d are basic and %d have basic slacks\n",uVar22
                ,(ulong)local_bc,(ulong)local_c0);
  }
  highs_solution->value_valid = true;
  highs_solution->dual_valid = true;
  highs_basis->valid = true;
  highs_basis->useful = true;
  HVar26 = kOk;
LAB_0025680d:
  if (row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar26;
}

Assistant:

HighsStatus ipxBasicSolutionToHighsBasicSolution(
    const HighsLogOptions& log_options, const HighsLp& lp,
    const std::vector<double>& rhs, const std::vector<char>& constraint_type,
    const IpxSolution& ipx_solution, HighsBasis& highs_basis,
    HighsSolution& highs_solution) {
  // Resize the HighsSolution and HighsBasis
  highs_solution.col_value.resize(lp.num_col_);
  highs_solution.row_value.resize(lp.num_row_);
  highs_solution.col_dual.resize(lp.num_col_);
  highs_solution.row_dual.resize(lp.num_row_);
  highs_basis.col_status.resize(lp.num_col_);
  highs_basis.row_status.resize(lp.num_row_);

  const std::vector<double>& ipx_col_value = ipx_solution.ipx_col_value;
  const std::vector<double>& ipx_row_value = ipx_solution.ipx_row_value;
  const std::vector<double>& ipx_col_dual = ipx_solution.ipx_col_dual;
  const std::vector<double>& ipx_row_dual = ipx_solution.ipx_row_dual;
  const std::vector<ipx::Int>& ipx_col_status = ipx_solution.ipx_col_status;
  const std::vector<ipx::Int>& ipx_row_status = ipx_solution.ipx_row_status;

  // Set up meaningful names for values of ipx_col_status and ipx_row_status to
  // be used later in comparisons
  const ipx::Int ipx_basic = 0;
  const ipx::Int ipx_nonbasic_at_lb = -1;
  const ipx::Int ipx_nonbasic_at_ub = -2;
  const ipx::Int ipx_superbasic = -3;
  // Row activities are needed to set activity values of free rows -
  // which are ignored by IPX
  vector<double> row_activity;
  bool get_row_activities = ipx_solution.num_row < lp.num_row_;
  if (get_row_activities) row_activity.assign(lp.num_row_, 0);
  HighsInt num_basic_variables = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    bool unrecognised = false;
    if (ipx_col_status[col] == ipx_basic) {
      // Column is basic
      highs_basis.col_status[col] = HighsBasisStatus::kBasic;
      highs_solution.col_value[col] = ipx_col_value[col];
      highs_solution.col_dual[col] = 0;
    } else {
      // Column is nonbasic. Setting of ipx_col_status is consistent
      // with dual value for fixed columns
      if (ipx_col_status[col] == ipx_nonbasic_at_lb) {
        // Column is at lower bound
        highs_basis.col_status[col] = HighsBasisStatus::kLower;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else if (ipx_col_status[col] == ipx_nonbasic_at_ub) {
        // Column is at upper bound
        highs_basis.col_status[col] = HighsBasisStatus::kUpper;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else if (ipx_col_status[col] == ipx_superbasic) {
        // Column is superbasic
        highs_basis.col_status[col] = HighsBasisStatus::kZero;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else {
        unrecognised = true;
        highsLogDev(log_options, HighsLogType::kError,
                    "\nError in IPX conversion: Unrecognised value "
                    "ipx_col_status[%2" HIGHSINT_FORMAT
                    "] = "
                    "%" HIGHSINT_FORMAT "\n",
                    col, (HighsInt)ipx_col_status[col]);
      }
    }
    if (unrecognised) {
      highsLogDev(log_options, HighsLogType::kError,
                  "Bounds [%11.4g, %11.4g]\n", lp.col_lower_[col],
                  lp.col_upper_[col]);
      highsLogDev(log_options, HighsLogType::kError,
                  "Col %2" HIGHSINT_FORMAT " ipx_col_status[%2" HIGHSINT_FORMAT
                  "] = %2" HIGHSINT_FORMAT "; x[%2" HIGHSINT_FORMAT
                  "] = %11.4g; z[%2" HIGHSINT_FORMAT
                  "] = "
                  "%11.4g\n",
                  col, col, (HighsInt)ipx_col_status[col], col,
                  ipx_col_value[col], col, ipx_col_dual[col]);
      assert(!unrecognised);
      highsLogUser(log_options, HighsLogType::kError,
                   "Unrecognised ipx_col_status value from IPX\n");
      return HighsStatus::kError;
    }
    if (get_row_activities) {
      // Accumulate row activities to assign value to free rows
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        row_activity[row] +=
            highs_solution.col_value[col] * lp.a_matrix_.value_[el];
      }
    }
    if (highs_basis.col_status[col] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  HighsInt ipx_row = 0;
  HighsInt ipx_slack = lp.num_col_;
  HighsInt num_boxed_rows = 0;
  HighsInt num_boxed_rows_basic = 0;
  HighsInt num_boxed_row_slacks_basic = 0;
  for (HighsInt row = 0; row < lp.num_row_; row++) {
    bool unrecognised = false;
    double lower = lp.row_lower_[row];
    double upper = lp.row_upper_[row];
    HighsInt this_ipx_row = ipx_row;
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free row - removed by IPX so make it basic at its row activity
      highs_basis.row_status[row] = HighsBasisStatus::kBasic;
      highs_solution.row_value[row] = row_activity[row];
      highs_solution.row_dual[row] = 0;
    } else {
      // Non-free row, so IPX will have it
      if ((lower > -kHighsInf && upper < kHighsInf) && (lower < upper)) {
        // Boxed row - look at its slack
        num_boxed_rows++;
        double slack_value = ipx_col_value[ipx_slack];
        double slack_dual = ipx_col_dual[ipx_slack];
        double value = slack_value;
        // @FlipRowDual -slack_dual became slack_dual
        double dual = slack_dual;
        if (ipx_row_status[ipx_row] == ipx_basic) {
          // Row is basic
          num_boxed_rows_basic++;
          highs_basis.row_status[row] = HighsBasisStatus::kBasic;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = 0;
        } else if (ipx_col_status[ipx_slack] == ipx_basic) {
          // Slack is basic
          num_boxed_row_slacks_basic++;
          highs_basis.row_status[row] = HighsBasisStatus::kBasic;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = 0;
        } else if (ipx_col_status[ipx_slack] == ipx_nonbasic_at_lb) {
          // Slack at lower bound
          highs_basis.row_status[row] = HighsBasisStatus::kLower;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (ipx_col_status[ipx_slack] == ipx_nonbasic_at_ub) {
          // Slack is at its upper bound
          assert(ipx_col_status[ipx_slack] == ipx_nonbasic_at_ub);
          highs_basis.row_status[row] = HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else {
          unrecognised = true;
          highsLogDev(log_options, HighsLogType::kError,
                      "Error in IPX conversion: Row %2" HIGHSINT_FORMAT
                      " (IPX row %2" HIGHSINT_FORMAT
                      ") has "
                      "unrecognised value ipx_col_status[%2" HIGHSINT_FORMAT
                      "] = %" HIGHSINT_FORMAT "\n",
                      row, ipx_row, ipx_slack,
                      (HighsInt)ipx_col_status[ipx_slack]);
        }
        // Update the slack to be used for boxed rows
        ipx_slack++;
      } else if (ipx_row_status[ipx_row] == ipx_basic) {
        // Row is basic
        highs_basis.row_status[row] = HighsBasisStatus::kBasic;
        highs_solution.row_value[row] = rhs[ipx_row] - ipx_row_value[ipx_row];
        highs_solution.row_dual[row] = 0;
      } else {
        // Nonbasic row at fixed value, lower bound or upper bound
        assert(ipx_row_status[ipx_row] ==
               -1);  // const ipx::Int ipx_nonbasic_row = -1;
        double value = rhs[ipx_row] - ipx_row_value[ipx_row];
        // @FlipRowDual -ipx_row_dual[ipx_row]; became ipx_row_dual[ipx_row];
        double dual = ipx_row_dual[ipx_row];
        if (constraint_type[ipx_row] == '>') {
          // Row is at its lower bound
          highs_basis.row_status[row] = HighsBasisStatus::kLower;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (constraint_type[ipx_row] == '<') {
          // Row is at its upper bound
          highs_basis.row_status[row] = HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (constraint_type[ipx_row] == '=') {
          // Row is at its fixed value: set HighsBasisStatus according
          // to sign of dual.
          //
          // Don't worry about maximization problems. IPX solves them
          // as minimizations with negated costs, so a negative dual
          // yields HighsBasisStatus::kUpper here, and dual signs are
          // then flipped below, so HighsBasisStatus::kUpper will have
          // corresponding positive dual.
          highs_basis.row_status[row] =
              dual >= 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else {
          unrecognised = true;
          highsLogDev(log_options, HighsLogType::kError,
                      "Error in IPX conversion: Row %2" HIGHSINT_FORMAT
                      ": cannot handle "
                      "constraint_type[%2" HIGHSINT_FORMAT
                      "] = %" HIGHSINT_FORMAT "\n",
                      row, ipx_row, constraint_type[ipx_row]);
        }
      }
      // Update the IPX row index
      ipx_row++;
    }
    if (unrecognised) {
      highsLogDev(log_options, HighsLogType::kError,
                  "Bounds [%11.4g, %11.4g]\n", lp.row_lower_[row],
                  lp.row_upper_[row]);
      highsLogDev(log_options, HighsLogType::kError,
                  "Row %2" HIGHSINT_FORMAT " ipx_row_status[%2" HIGHSINT_FORMAT
                  "] = %2" HIGHSINT_FORMAT "; s[%2" HIGHSINT_FORMAT
                  "] = %11.4g; y[%2" HIGHSINT_FORMAT
                  "] = "
                  "%11.4g\n",
                  row, this_ipx_row, (HighsInt)ipx_row_status[this_ipx_row],
                  this_ipx_row, ipx_row_value[this_ipx_row], this_ipx_row,
                  ipx_row_dual[this_ipx_row]);
      assert(!unrecognised);
      highsLogUser(log_options, HighsLogType::kError,
                   "Unrecognised ipx_row_status value from IPX\n");
      return HighsStatus::kError;
    }
    if (highs_basis.row_status[row] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  assert(num_basic_variables == lp.num_row_);
  assert(ipx_row == ipx_solution.num_row);
  assert(ipx_slack == ipx_solution.num_col);

  if (lp.sense_ == ObjSense::kMaximize) {
    // Flip dual values since original LP is maximization
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      highs_solution.col_dual[iCol] *= -1;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      highs_solution.row_dual[iRow] *= -1;
  }

  if (num_boxed_rows)
    highsLogDev(log_options, HighsLogType::kInfo,
                "Of %" HIGHSINT_FORMAT " boxed rows: %" HIGHSINT_FORMAT
                " are basic and %" HIGHSINT_FORMAT " have basic slacks\n",
                num_boxed_rows, num_boxed_rows_basic,
                num_boxed_row_slacks_basic);
  // Indicate that the primal solution, dual solution and basis are valid
  highs_solution.value_valid = true;
  highs_solution.dual_valid = true;
  highs_basis.valid = true;
  highs_basis.useful = true;
  return HighsStatus::kOk;
}